

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::ValueIteratorBase::increment(ValueIteratorBase *this)

{
  ValueIteratorBase *this_local;
  
  std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator++
            (&this->current_);
  return;
}

Assistant:

void ValueIteratorBase::increment() {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  ++current_;
#else
  if (isArray_)
    ValueInternalArray::increment(iterator_.array_);
  ValueInternalMap::increment(iterator_.map_);
#endif
}